

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

int re2::RE2::GlobalReplace(string *str,RE2 *re,StringPiece *rewrite)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  pointer pcVar4;
  pointer pcVar5;
  pointer pcVar6;
  int iVar7;
  pointer pcVar8;
  string out;
  StringPiece vec [17];
  string local_180;
  StringPiece *local_160;
  StringPiece local_158;
  StringPiece local_148 [17];
  
  lVar3 = 8;
  do {
    *(undefined8 *)((long)local_148 + lVar3 + -8) = 0;
    *(undefined4 *)((long)&local_148[0].ptr_ + lVar3) = 0;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x118);
  uVar2 = MaxSubmatch(rewrite);
  iVar7 = 0;
  if (uVar2 < 0x11) {
    pcVar5 = (str->_M_dataplus)._M_p;
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    local_180._M_string_length = 0;
    local_180.field_2._M_local_buf[0] = '\0';
    if ((long)str->_M_string_length < 0) {
      iVar7 = 0;
    }
    else {
      pcVar6 = pcVar5 + str->_M_string_length;
      iVar7 = 0;
      pcVar8 = pcVar5;
      local_160 = rewrite;
      pcVar4 = (pointer)0x0;
      do {
        while( true ) {
          local_158.ptr_ = (str->_M_dataplus)._M_p;
          local_158.length_ = (int)str->_M_string_length;
          bVar1 = Match(re,&local_158,(int)pcVar5 - (int)local_158.ptr_,local_158.length_,UNANCHORED
                        ,local_148,uVar2 + 1);
          if (!bVar1) goto LAB_001353ad;
          if (pcVar8 < local_148[0].ptr_) {
            std::__cxx11::string::append((char *)&local_180,(ulong)pcVar8);
          }
          if ((local_148[0].ptr_ == pcVar4) && (local_148[0].length_ == 0)) break;
          Rewrite(re,&local_180,local_160,local_148,uVar2 + 1);
          pcVar5 = local_148[0].ptr_ + local_148[0].length_;
          iVar7 = iVar7 + 1;
          pcVar8 = pcVar5;
          pcVar4 = pcVar5;
          if (pcVar6 < pcVar5) goto LAB_001353ba;
        }
        if (pcVar8 < pcVar6) {
          std::__cxx11::string::append((char *)&local_180,(ulong)pcVar8);
        }
        pcVar8 = pcVar8 + 1;
        pcVar5 = (pointer)(ulong)((int)pcVar5 + 1);
      } while (pcVar8 <= pcVar6);
LAB_001353ad:
      pcVar5 = pcVar8;
      if (iVar7 == 0) {
        iVar7 = 0;
      }
      else {
LAB_001353ba:
        if (pcVar5 < pcVar6) {
          std::__cxx11::string::append((char *)&local_180,(ulong)pcVar5);
        }
        std::__cxx11::string::swap((string *)&local_180);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p);
    }
  }
  return iVar7;
}

Assistant:

int RE2::GlobalReplace(string *str,
                      const RE2& re,
                      const StringPiece& rewrite) {
  StringPiece vec[kVecSize];
  int nvec = 1 + MaxSubmatch(rewrite);
  if (nvec > arraysize(vec))
    return false;

  const char* p = str->data();
  const char* ep = p + str->size();
  const char* lastend = NULL;
  string out;
  int count = 0;
  while (p <= ep) {
    if (!re.Match(*str, static_cast<int>(p - str->data()),
                  static_cast<int>(str->size()), UNANCHORED, vec, nvec))
      break;
    if (p < vec[0].begin())
      out.append(p, vec[0].begin() - p);
    if (vec[0].begin() == lastend && vec[0].size() == 0) {
      // Disallow empty match at end of last match: skip ahead.
      if (p < ep)
        out.append(p, 1);
      p++;
      continue;
    }
    re.Rewrite(&out, rewrite, vec, nvec);
    p = vec[0].end();
    lastend = p;
    count++;
  }

  if (count == 0)
    return 0;

  if (p < ep)
    out.append(p, ep - p);
  swap(out, *str);
  return count;
}